

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O2

bool storage::BTree::check_(BTNode *nd)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int i;
  long lVar5;
  
  BTNode::get_right_brother(nd);
  BTNode::get_left_brother(nd);
  iVar3 = nd->used_links_count_;
  bVar1 = cc(nd->keys_,iVar3 + -1);
  if (!bVar1) {
    __assert_fail("cc(nd->keys_, nd->key_count())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                  ,0x160,"static bool storage::BTree::check_(BTNode *)");
  }
  if (nd->parent_ == (BTNode *)0x0) {
    if (iVar3 < 2) {
      return false;
    }
  }
  else if (iVar3 < 0x19) {
    return false;
  }
  iVar3 = (**nd->_vptr_BTNode)(nd);
  bVar1 = true;
  if ((char)iVar3 == '\0') {
    lVar5 = 0;
    lVar4 = __dynamic_cast(nd,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
    do {
      bVar1 = *(int *)(lVar4 + 0xdc) <= lVar5;
      if (*(int *)(lVar4 + 0xdc) <= lVar5) {
        return bVar1;
      }
      bVar2 = check_(*(BTNode **)(lVar4 + 0xe0 + lVar5 * 8));
      lVar5 = lVar5 + 1;
    } while (bVar2);
  }
  return bVar1;
}

Assistant:

bool BTree::check_(BTNode *nd) {
        nd->get_right_brother();
        nd->get_left_brother();
        assert(cc(nd->keys_, nd->key_count()));
        BTNode *node = nd;
        if (!node->parent_) {
            if (node->used_links_count_ < 2)
                return false;
        } else {
            if (!node->check())
                return false;
        }
        if (!node->is_leaf_node()) {
            auto inner_node = dynamic_cast<BTInnerNode *>(node);
            for (int i = 0; i < inner_node->used_links_count_; ++i) {
                if (!check_(inner_node->links_[i]))
                    return false;
            }
        }
        return true;
    }